

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceObjectArchive::AppendDeviceData
          (DeviceObjectArchive *this,DeviceObjectArchive *Src,DeviceType Dev)

{
  pointer pSVar1;
  IMemoryAllocator *Allocator;
  const_iterator cVar2;
  pointer this_00;
  ulong uVar3;
  __node_base *p_Var4;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *this_01;
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  *__range1;
  SerializedData local_58;
  
  Allocator = GetRawAllocator();
  p_Var4 = &(this->m_NamedResources)._M_h._M_before_begin;
  uVar3 = (ulong)Dev;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    local_58.m_Size = 0;
    local_58.m_Hash.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    local_58.m_pAllocator = (IMemoryAllocator *)0x0;
    local_58.m_Ptr = (void *)0x0;
    SerializedData::operator=((SerializedData *)(p_Var4 + uVar3 * 4 + 8),&local_58);
    SerializedData::~SerializedData(&local_58);
    cVar2 = std::
            _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)Src,(key_type *)(p_Var4 + 1));
    if (cVar2.
        super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
        ._M_cur != (__node_type *)0x0) {
      SerializedData::MakeCopy
                (&local_58,
                 (SerializedData *)
                 ((long)cVar2.
                        super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                        ._M_cur + uVar3 * 0x20 + 0x40),Allocator);
      SerializedData::operator=((SerializedData *)(p_Var4 + uVar3 * 4 + 8),&local_58);
      SerializedData::~SerializedData(&local_58);
    }
  }
  this_01 = (this->m_DeviceShaders)._M_elems + uVar3;
  std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::clear(this_01);
  pSVar1 = (Src->m_DeviceShaders)._M_elems[uVar3].
           super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (Src->m_DeviceShaders)._M_elems[uVar3].
                 super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pSVar1; this_00 = this_00 + 1
      ) {
    SerializedData::MakeCopy(&local_58,this_00,Allocator);
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
    emplace_back<Diligent::SerializedData>(this_01,&local_58);
    SerializedData::~SerializedData(&local_58);
  }
  return;
}

Assistant:

void DeviceObjectArchive::AppendDeviceData(const DeviceObjectArchive& Src, DeviceType Dev) noexcept(false)
{
    auto& Allocator = GetRawAllocator();
    for (auto& dst_res_it : m_NamedResources)
    {
        auto& DstData = dst_res_it.second.DeviceSpecific[static_cast<size_t>(Dev)];
        // Clear dst device data to make sure we don't have invalid shader indices
        DstData = {};

        auto src_res_it = Src.m_NamedResources.find(dst_res_it.first);
        if (src_res_it == Src.m_NamedResources.end())
            continue;

        const auto& SrcData{src_res_it->second.DeviceSpecific[static_cast<size_t>(Dev)]};
        // Always copy src data even if it is empty
        DstData = SrcData.MakeCopy(Allocator);
    }

    // Copy all shaders to make sure PSO shader indices are correct
    const auto& SrcShaders = Src.m_DeviceShaders[static_cast<size_t>(Dev)];
    auto&       DstShaders = m_DeviceShaders[static_cast<size_t>(Dev)];
    DstShaders.clear();
    for (const auto& SrcShader : SrcShaders)
        DstShaders.emplace_back(SrcShader.MakeCopy(Allocator));
}